

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testError.cpp
# Opt level: O0

void anon_unknown.dwarf_bd0dc::testNormalizedRounding(int n)

{
  half extraout_AX;
  ostream *poVar1;
  void *pvVar2;
  int in_EDI;
  float fVar3;
  half *this;
  double __x;
  double extraout_XMM0_Qa;
  float e;
  half r;
  half h;
  int i;
  float eMax;
  float eExpected;
  undefined4 in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  float local_1c;
  half local_12;
  uint local_10;
  float local_c;
  float local_8;
  int local_4;
  
  local_4 = in_EDI;
  poVar1 = std::operator<<((ostream *)&std::cout,"rounding normalized numbers to ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_4);
  std::operator<<(poVar1,"-bit precision\n");
  if (local_4 < 10) {
    this = (half *)((double)(1 << (10U - (char)local_4 & 0x1f)) * 0.00048828);
  }
  else {
    this = (half *)0x0;
  }
  local_8 = (float)(double)this;
  local_c = 0.0;
  local_10 = 0;
  do {
    if (199999 < (int)local_10) {
      poVar1 = std::operator<<((ostream *)&std::cout,"max error          = ");
      pvVar2 = (void *)std::ostream::operator<<(poVar1,local_c);
      std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,"max expected error = ");
      pvVar2 = (void *)std::ostream::operator<<(poVar1,local_8);
      std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,"ok\n\n");
      std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
      return;
    }
    drand();
    Imath_3_2::half::half(this,in_stack_ffffffffffffffcc);
    fVar3 = Imath_3_2::half::operator_cast_to_float(this);
    __x = 6.10351562e-05;
    if (6.1035156e-05 <= fVar3) {
      if ((local_10 & 1) != 0) {
        local_12 = Imath_3_2::half::operator-
                             ((half *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
        ;
        __x = extraout_XMM0_Qa;
      }
      Imath_3_2::half::round(&local_12,__x);
      in_stack_ffffffffffffffcc = Imath_3_2::half::operator_cast_to_float(this);
      fVar3 = Imath_3_2::half::operator_cast_to_float(this);
      local_1c = 1.0 - in_stack_ffffffffffffffcc / fVar3;
      if (local_1c < 0.0) {
        local_1c = -local_1c;
      }
      if (local_8 < local_1c) {
        poVar1 = std::operator<<((ostream *)&std::cout,"half = ");
        poVar1 = (ostream *)::operator<<(poVar1,local_12);
        poVar1 = std::operator<<(poVar1,", rounded = ");
        poVar1 = (ostream *)::operator<<(poVar1,extraout_AX);
        poVar1 = std::operator<<(poVar1,", error = ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
        poVar1 = std::operator<<(poVar1,", expected error = ");
        pvVar2 = (void *)std::ostream::operator<<(poVar1,local_8);
        std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
        printBits((ostream *)&std::cout,local_12);
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        printBits((ostream *)&std::cout,extraout_AX);
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testError.cpp"
                      ,0x89,"void (anonymous namespace)::testNormalizedRounding(int)");
      }
      if (local_c < local_1c) {
        local_c = local_1c;
      }
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

void
testNormalizedRounding (int n)
{
    cout << "rounding normalized numbers to " << n << "-bit precision\n";

    float eExpected = (n < 10) ? HALF_EPSILON * 0.5f * (1 << (10 - n)) : 0;
    float eMax      = 0;

    for (int i = 0; i < 200000; i++)
    {
        half h (drand () * HALF_MAX);

        if (h < HALF_NRM_MIN) continue;

        if (i & 1) h = -h;

        half  r (h.round (n));
        float e = 1.0f - r / h;

        if (e < 0) e = -e;

        if (e > eExpected)
        {
            cout << "half = " << h << ", rounded = " << r << ", error = " << e
                 << ", expected error = " << eExpected << endl;

            printBits (cout, h);
            cout << endl;
            printBits (cout, r);
            cout << endl;

            assert (false);
        }

        if (e > eMax) eMax = e;
    }

    cout << "max error          = " << eMax << endl;
    cout << "max expected error = " << eExpected << endl;
    cout << "ok\n\n" << flush;
}